

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

int __thiscall
leveldb::Version::PickLevelForMemTableOutput
          (Version *this,Slice *smallest_user_key,Slice *largest_user_key)

{
  long lVar1;
  bool bVar2;
  Version *in_RDI;
  long in_FS_OFFSET;
  int64_t sum;
  int level;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> overlaps;
  InternalKey limit;
  InternalKey start;
  Options *in_stack_ffffffffffffff28;
  Slice *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  InternalKey *in_stack_ffffffffffffff40;
  Version *in_stack_ffffffffffffff48;
  InternalKey *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  SequenceNumber in_stack_ffffffffffffff68;
  int local_7c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_7c = 0;
  bVar2 = OverlapInLevel(in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                         (Slice *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                         in_stack_ffffffffffffff30);
  if (!bVar2) {
    InternalKey::InternalKey
              ((InternalKey *)in_RDI,
               (Slice *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff68,(ValueType)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    InternalKey::InternalKey
              ((InternalKey *)in_RDI,
               (Slice *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff68,(ValueType)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               in_stack_ffffffffffffff28);
    for (; local_7c < 2; local_7c = local_7c + 1) {
      bVar2 = OverlapInLevel(in_stack_ffffffffffffff48,
                             (int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                             (Slice *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff5c = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff5c);
      if (bVar2) break;
      if (local_7c + 2 < 7) {
        GetOverlappingInputs
                  (in_RDI,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff50,
                   (InternalKey *)in_stack_ffffffffffffff48,
                   (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff40 =
             (InternalKey *)
             TotalFileSize((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff50 = in_stack_ffffffffffffff40;
        in_stack_ffffffffffffff48 = (Version *)MaxGrandParentOverlapBytes(in_stack_ffffffffffffff28)
        ;
        if ((long)in_stack_ffffffffffffff48 < (long)in_stack_ffffffffffffff40) break;
      }
    }
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    InternalKey::~InternalKey((InternalKey *)in_stack_ffffffffffffff28);
    InternalKey::~InternalKey((InternalKey *)in_stack_ffffffffffffff28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_7c;
}

Assistant:

int Version::PickLevelForMemTableOutput(const Slice& smallest_user_key,
                                        const Slice& largest_user_key) {
  int level = 0;
  if (!OverlapInLevel(0, &smallest_user_key, &largest_user_key)) {
    // Push to next level if there is no overlap in next level,
    // and the #bytes overlapping in the level after that are limited.
    InternalKey start(smallest_user_key, kMaxSequenceNumber, kValueTypeForSeek);
    InternalKey limit(largest_user_key, 0, static_cast<ValueType>(0));
    std::vector<FileMetaData*> overlaps;
    while (level < config::kMaxMemCompactLevel) {
      if (OverlapInLevel(level + 1, &smallest_user_key, &largest_user_key)) {
        break;
      }
      if (level + 2 < config::kNumLevels) {
        // Check that file does not overlap too many grandparent bytes.
        GetOverlappingInputs(level + 2, &start, &limit, &overlaps);
        const int64_t sum = TotalFileSize(overlaps);
        if (sum > MaxGrandParentOverlapBytes(vset_->options_)) {
          break;
        }
      }
      level++;
    }
  }
  return level;
}